

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tck-reach.cc
# Opt level: O0

void reach(system_declaration_t *sysdecl)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<stats_t,_shared_ptr<graph_t>_>_> *this;
  reference __in;
  type *ptVar2;
  type *ptVar3;
  ostream *poVar4;
  element_type *peVar5;
  string *psVar6;
  bool *pbVar7;
  concrete_cex_t *__p;
  pointer this_00;
  runtime_error *prVar8;
  type cex_00;
  symbolic_cex_t *__p_00;
  finite_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t> *this_01
  ;
  type cex_01;
  unique_ptr<tchecker::zg::path::symbolic::finite_path_t,_std::default_delete<tchecker::zg::path::symbolic::finite_path_t>_>
  local_e0;
  unique_ptr<tchecker::zg::path::symbolic::finite_path_t,_std::default_delete<tchecker::zg::path::symbolic::finite_path_t>_>
  cex_1;
  unique_ptr<tchecker::zg::path::concrete::finite_path_t,_std::default_delete<tchecker::zg::path::concrete::finite_path_t>_>
  cex;
  type *value;
  type *key;
  _Self local_b8;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  undefined1 local_90 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  type *graph;
  type *stats;
  tuple<tchecker::algorithms::reach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
  *local_18;
  system_declaration_t *local_10;
  system_declaration_t *sysdecl_local;
  
  local_10 = sysdecl;
  tchecker::tck_reach::zg_reach::run
            ((tuple<tchecker::algorithms::reach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
              *)&stats,sysdecl,&labels_abi_cxx11_,&search_order_abi_cxx11_,block_size,table_size);
  local_18 = (tuple<tchecker::algorithms::reach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
              *)&stats;
  this = std::
         get<0ul,tchecker::algorithms::reach::stats_t,std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>>
                   ((tuple<tchecker::algorithms::reach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
                     *)&stats);
  m._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::
               get<1ul,tchecker::algorithms::reach::stats_t,std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>>
                         (local_18);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_90);
  tchecker::algorithms::reach::stats_t::attributes
            (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_90);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_90);
  local_b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_90);
  while (bVar1 = std::operator!=(&__end1,&local_b8), poVar4 = os, bVar1) {
    __in = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator*(&__end1);
    ptVar2 = std::get<0ul,std::__cxx11::string_const,std::__cxx11::string>(__in);
    ptVar3 = std::get<1ul,std::__cxx11::string_const,std::__cxx11::string>(__in);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)ptVar2);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,(string *)ptVar3);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  if (certificate == CERTIFICATE_GRAPH) {
    peVar5 = std::
             __shared_ptr_access<tchecker::tck_reach::zg_reach::graph_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<tchecker::tck_reach::zg_reach::graph_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)m._M_t._M_impl.super__Rb_tree_header._M_node_count);
    psVar6 = tchecker::parsing::system_declaration_t::name_abi_cxx11_(local_10);
    tchecker::tck_reach::zg_reach::dot_output(poVar4,peVar5,psVar6);
  }
  else if ((certificate == CERTIFICATE_CONCRETE) &&
          (pbVar7 = tchecker::algorithms::reach::stats_t::reachable(this), (*pbVar7 & 1U) != 0)) {
    peVar5 = std::
             __shared_ptr_access<tchecker::tck_reach::zg_reach::graph_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<tchecker::tck_reach::zg_reach::graph_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)m._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __p = tchecker::tck_reach::zg_reach::cex::concrete_counter_example(peVar5);
    std::
    unique_ptr<tchecker::zg::path::concrete::finite_path_t,std::default_delete<tchecker::zg::path::concrete::finite_path_t>>
    ::unique_ptr<std::default_delete<tchecker::zg::path::concrete::finite_path_t>,void>
              ((unique_ptr<tchecker::zg::path::concrete::finite_path_t,std::default_delete<tchecker::zg::path::concrete::finite_path_t>>
                *)&cex_1,__p);
    this_00 = std::
              unique_ptr<tchecker::zg::path::concrete::finite_path_t,_std::default_delete<tchecker::zg::path::concrete::finite_path_t>_>
              ::operator->((unique_ptr<tchecker::zg::path::concrete::finite_path_t,_std::default_delete<tchecker::zg::path::concrete::finite_path_t>_>
                            *)&cex_1);
    bVar1 = tchecker::graph::
            finite_path_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
            ::empty((finite_path_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
                     *)this_00);
    poVar4 = os;
    if (bVar1) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"Unable to compute a concrete counter example");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cex_00 = std::
             unique_ptr<tchecker::zg::path::concrete::finite_path_t,_std::default_delete<tchecker::zg::path::concrete::finite_path_t>_>
             ::operator*((unique_ptr<tchecker::zg::path::concrete::finite_path_t,_std::default_delete<tchecker::zg::path::concrete::finite_path_t>_>
                          *)&cex_1);
    psVar6 = tchecker::parsing::system_declaration_t::name_abi_cxx11_(local_10);
    tchecker::tck_reach::zg_reach::cex::dot_output(poVar4,cex_00,psVar6);
    std::
    unique_ptr<tchecker::zg::path::concrete::finite_path_t,_std::default_delete<tchecker::zg::path::concrete::finite_path_t>_>
    ::~unique_ptr((unique_ptr<tchecker::zg::path::concrete::finite_path_t,_std::default_delete<tchecker::zg::path::concrete::finite_path_t>_>
                   *)&cex_1);
  }
  else if ((certificate == CERTIFICATE_SYMBOLIC) &&
          (pbVar7 = tchecker::algorithms::reach::stats_t::reachable(this), (*pbVar7 & 1U) != 0)) {
    peVar5 = std::
             __shared_ptr_access<tchecker::tck_reach::zg_reach::graph_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<tchecker::tck_reach::zg_reach::graph_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)m._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __p_00 = tchecker::tck_reach::zg_reach::cex::symbolic_counter_example(peVar5);
    std::
    unique_ptr<tchecker::zg::path::symbolic::finite_path_t,std::default_delete<tchecker::zg::path::symbolic::finite_path_t>>
    ::unique_ptr<std::default_delete<tchecker::zg::path::symbolic::finite_path_t>,void>
              ((unique_ptr<tchecker::zg::path::symbolic::finite_path_t,std::default_delete<tchecker::zg::path::symbolic::finite_path_t>>
                *)&local_e0,__p_00);
    this_01 = (finite_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
               *)std::
                 unique_ptr<tchecker::zg::path::symbolic::finite_path_t,_std::default_delete<tchecker::zg::path::symbolic::finite_path_t>_>
                 ::operator->(&local_e0);
    bVar1 = tchecker::graph::
            finite_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
            ::empty(this_01);
    poVar4 = os;
    if (bVar1) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"Unable to compute a symbolic counter example");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cex_01 = std::
             unique_ptr<tchecker::zg::path::symbolic::finite_path_t,_std::default_delete<tchecker::zg::path::symbolic::finite_path_t>_>
             ::operator*(&local_e0);
    psVar6 = tchecker::parsing::system_declaration_t::name_abi_cxx11_(local_10);
    tchecker::tck_reach::zg_reach::cex::dot_output(poVar4,cex_01,psVar6);
    std::
    unique_ptr<tchecker::zg::path::symbolic::finite_path_t,_std::default_delete<tchecker::zg::path::symbolic::finite_path_t>_>
    ::~unique_ptr(&local_e0);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_90);
  std::
  tuple<tchecker::algorithms::reach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
  ::~tuple((tuple<tchecker::algorithms::reach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
            *)&stats);
  return;
}

Assistant:

void reach(tchecker::parsing::system_declaration_t const & sysdecl)
{
  auto && [stats, graph] = tchecker::tck_reach::zg_reach::run(sysdecl, labels, search_order, block_size, table_size);

  // stats
  std::map<std::string, std::string> m;
  stats.attributes(m);
  for (auto && [key, value] : m)
    std::cout << key << " " << value << std::endl;

  // certificate
  if (certificate == CERTIFICATE_GRAPH)
    tchecker::tck_reach::zg_reach::dot_output(*os, *graph, sysdecl.name());
  else if ((certificate == CERTIFICATE_CONCRETE) && stats.reachable()) {
    std::unique_ptr<tchecker::tck_reach::zg_reach::cex::concrete_cex_t> cex{
        tchecker::tck_reach::zg_reach::cex::concrete_counter_example(*graph)};
    if (cex->empty())
      throw std::runtime_error("Unable to compute a concrete counter example");
    tchecker::tck_reach::zg_reach::cex::dot_output(*os, *cex, sysdecl.name());
  }
  else if ((certificate == CERTIFICATE_SYMBOLIC) && stats.reachable()) {
    std::unique_ptr<tchecker::tck_reach::zg_reach::cex::symbolic_cex_t> cex{
        tchecker::tck_reach::zg_reach::cex::symbolic_counter_example(*graph)};
    if (cex->empty())
      throw std::runtime_error("Unable to compute a symbolic counter example");
    tchecker::tck_reach::zg_reach::cex::dot_output(*os, *cex, sysdecl.name());
  }
}